

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O0

void __thiscall btConeTwistConstraint::getInfo1(btConeTwistConstraint *this,btConstraintInfo1 *info)

{
  int *in_RSI;
  long in_RDI;
  btMatrix3x3 *in_stack_000004f0;
  btMatrix3x3 *in_stack_000004f8;
  btTransform *in_stack_00000500;
  btTransform *in_stack_00000508;
  btConeTwistConstraint *in_stack_00000510;
  
  if ((*(byte *)(in_RDI + 0x227) & 1) == 0) {
    *in_RSI = 3;
    in_RSI[1] = 3;
    btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x28));
    btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x30));
    btRigidBody::getInvInertiaTensorWorld(*(btRigidBody **)(in_RDI + 0x28));
    btRigidBody::getInvInertiaTensorWorld(*(btRigidBody **)(in_RDI + 0x30));
    calcAngleInfo2(in_stack_00000510,in_stack_00000508,in_stack_00000500,in_stack_000004f8,
                   in_stack_000004f0);
    if ((*(byte *)(in_RDI + 0x226) & 1) != 0) {
      *in_RSI = *in_RSI + 1;
      in_RSI[1] = in_RSI[1] + -1;
      if ((*(float *)(in_RDI + 0x1d4) < *(float *)(in_RDI + 0x1e0)) &&
         (*(float *)(in_RDI + 0x1d8) < *(float *)(in_RDI + 0x1e0))) {
        *in_RSI = *in_RSI + 1;
        in_RSI[1] = in_RSI[1] + -1;
      }
    }
    if ((*(byte *)(in_RDI + 0x225) & 1) != 0) {
      *in_RSI = *in_RSI + 1;
      in_RSI[1] = in_RSI[1] + -1;
    }
  }
  else {
    *in_RSI = 0;
    in_RSI[1] = 0;
  }
  return;
}

Assistant:

void btConeTwistConstraint::getInfo1 (btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	} 
	else
	{
		info->m_numConstraintRows = 3;
		info->nub = 3;
		calcAngleInfo2(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform(),m_rbA.getInvInertiaTensorWorld(),m_rbB.getInvInertiaTensorWorld());
		if(m_solveSwingLimit)
		{
			info->m_numConstraintRows++;
			info->nub--;
			if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
			{
				info->m_numConstraintRows++;
				info->nub--;
			}
		}
		if(m_solveTwistLimit)
		{
			info->m_numConstraintRows++;
			info->nub--;
		}
	}
}